

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_extract.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::UnionExtractBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  __type _Var1;
  int iVar2;
  reference pvVar3;
  pointer pEVar4;
  idx_t __n;
  reference this_00;
  type expr;
  string *str;
  string *psVar5;
  LogicalType *other;
  BinderException *pBVar6;
  InternalException *this_01;
  ParameterNotResolvedException *this_02;
  idx_t i_1;
  size_t i;
  idx_t iVar7;
  allocator local_171;
  string key;
  idx_t local_140;
  string local_138;
  string message;
  Value key_val;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  candidates;
  LogicalType return_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  closest_settings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  if ((pEVar4->return_type).id_ == UNKNOWN) {
    this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_02);
  }
  else {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    if ((pEVar4->return_type).id_ != UNION) {
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&key_val,"union_extract can only take a union parameter",
                 (allocator *)&key);
      BinderException::BinderException(pBVar6,(string *)&key_val);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    __n = UnionType::GetMemberCount(&pEVar4->return_type);
    if (__n == 0) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&key_val,"Can\'t extract something from an empty union",(allocator *)&key
                );
      InternalException::InternalException(this_01,(string *)&key_val);
      __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    this_00 = vector<duckdb::LogicalType,_true>::get<true>
                        (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,
                         0);
    LogicalType::operator=(this_00,&pEVar4->return_type);
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,1);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])(pEVar4);
    if ((char)iVar2 == '\0') {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      if ((pEVar4->return_type).id_ == VARCHAR) {
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar3);
        iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar4);
        if ((char)iVar2 != '\0') {
          expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator*(pvVar3);
          ExpressionExecutor::EvaluateScalar(&key_val,context,expr,false);
          str = StringValue::Get_abi_cxx11_(&key_val);
          if ((key_val.is_null == false) && (str->_M_string_length != 0)) {
            StringUtil::Lower((string *)&key,(string *)str);
            LogicalType::LogicalType(&return_type);
            iVar7 = 0;
            while( true ) {
              if (__n == iVar7) {
                candidates.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                candidates.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                candidates.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&candidates,__n);
                for (iVar7 = 0; __n != iVar7; iVar7 = iVar7 + 1) {
                  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           ::get<true>(arguments,0);
                  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           ::operator->(pvVar3);
                  psVar5 = UnionType::GetMemberName_abi_cxx11_(&pEVar4->return_type,iVar7);
                  ::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&candidates,(value_type *)psVar5);
                }
                StringUtil::TopNJaroWinkler(&closest_settings,&candidates,(string *)&key,5,0.5);
                ::std::__cxx11::string::string((string *)&local_138,"Candidate Entries",&local_171);
                StringUtil::CandidatesMessage((string *)&message,&closest_settings,&local_138);
                ::std::__cxx11::string::~string((string *)&local_138);
                pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
                ::std::__cxx11::string::string
                          ((string *)&local_138,"Could not find key \"%s\" in union\n%s",&local_171)
                ;
                ::std::__cxx11::string::string((string *)&local_50,(string *)&key);
                ::std::__cxx11::string::string((string *)&local_70,(string *)&message);
                BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                          (pBVar6,(string *)&local_138,&local_50,&local_70);
                __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
              }
              pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                       ::get<true>(arguments,0);
              pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator->(pvVar3);
              psVar5 = UnionType::GetMemberName_abi_cxx11_(&pEVar4->return_type,iVar7);
              StringUtil::Lower((string *)&message,psVar5);
              _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&message,&key);
              ::std::__cxx11::string::~string((string *)&message);
              if (_Var1) break;
              iVar7 = iVar7 + 1;
            }
            local_140 = iVar7;
            pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                     ::get<true>(arguments,0);
            pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(pvVar3);
            other = UnionType::GetMemberType(&pEVar4->return_type,iVar7);
            LogicalType::operator=(&return_type,other);
            LogicalType::operator=
                      (&(bound_function->super_BaseScalarFunction).return_type,&return_type);
            make_uniq<duckdb::UnionExtractBindData,std::__cxx11::string&,unsigned_long&,duckdb::LogicalType&>
                      ((duckdb *)&message,&key,&local_140,&return_type);
            *(pointer *)this = message._M_dataplus._M_p;
            LogicalType::~LogicalType(&return_type);
            ::std::__cxx11::string::~string((string *)&key);
            Value::~Value(&key_val);
            return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                   (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
                   this;
          }
          pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&key,"Key name for union_extract needs to be neither NULL nor empty",
                     (allocator *)&message);
          BinderException::BinderException(pBVar6,&key);
          __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&key_val,"Key name for union_extract needs to be a constant string",
                 (allocator *)&key);
      BinderException::BinderException(pBVar6,(string *)&key_val);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
    ParameterNotResolvedException::ParameterNotResolvedException(this_02);
  }
  __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> UnionExtractBind(ClientContext &context, ScalarFunction &bound_function,
                                                 vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(bound_function.arguments.size() == 2);
	if (arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	if (arguments[0]->return_type.id() != LogicalTypeId::UNION) {
		throw BinderException("union_extract can only take a union parameter");
	}
	idx_t union_member_count = UnionType::GetMemberCount(arguments[0]->return_type);
	if (union_member_count == 0) {
		throw InternalException("Can't extract something from an empty union");
	}
	bound_function.arguments[0] = arguments[0]->return_type;

	auto &key_child = arguments[1];
	if (key_child->HasParameter()) {
		throw ParameterNotResolvedException();
	}

	if (key_child->return_type.id() != LogicalTypeId::VARCHAR || !key_child->IsFoldable()) {
		throw BinderException("Key name for union_extract needs to be a constant string");
	}
	Value key_val = ExpressionExecutor::EvaluateScalar(context, *key_child);
	D_ASSERT(key_val.type().id() == LogicalTypeId::VARCHAR);
	auto &key_str = StringValue::Get(key_val);
	if (key_val.IsNull() || key_str.empty()) {
		throw BinderException("Key name for union_extract needs to be neither NULL nor empty");
	}
	string key = StringUtil::Lower(key_str);

	LogicalType return_type;
	idx_t key_index = 0;
	bool found_key = false;

	for (size_t i = 0; i < union_member_count; i++) {
		auto &member_name = UnionType::GetMemberName(arguments[0]->return_type, i);
		if (StringUtil::Lower(member_name) == key) {
			found_key = true;
			key_index = i;
			return_type = UnionType::GetMemberType(arguments[0]->return_type, i);
			break;
		}
	}

	if (!found_key) {
		vector<string> candidates;
		candidates.reserve(union_member_count);
		for (idx_t i = 0; i < union_member_count; i++) {
			candidates.push_back(UnionType::GetMemberName(arguments[0]->return_type, i));
		}
		auto closest_settings = StringUtil::TopNJaroWinkler(candidates, key);
		auto message = StringUtil::CandidatesMessage(closest_settings, "Candidate Entries");
		throw BinderException("Could not find key \"%s\" in union\n%s", key, message);
	}

	bound_function.return_type = return_type;
	return make_uniq<UnionExtractBindData>(key, key_index, return_type);
}